

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool __thiscall
ON__OBSOLETE__CircleCurve::Read(ON__OBSOLETE__CircleCurve *this,ON_BinaryArchive *file)

{
  undefined1 local_b0 [8];
  ON_Circle circle;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON__OBSOLETE__CircleCurve *this_local;
  
  iStack_1c = 0;
  local_20 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  circle.radius._7_1_ =
       ON_BinaryArchive::Read3dmChunkVersion(file,&stack0xffffffffffffffe4,&local_20);
  if (((bool)circle.radius._7_1_) && (iStack_1c == 1)) {
    ON_Circle::ON_Circle((ON_Circle *)local_b0);
    circle.radius._7_1_ = ON_BinaryArchive::ReadCircle(_minor_version,(ON_Circle *)local_b0);
    ON_Arc::operator=(&(this->super_ON_ArcCurve).m_arc,(ON_Circle *)local_b0);
    if ((circle.radius._7_1_ & 1) != 0) {
      circle.radius._7_1_ =
           ON_BinaryArchive::ReadInterval(_minor_version,&(this->super_ON_ArcCurve).m_t);
    }
    if ((circle.radius._7_1_ & 1) != 0) {
      circle.radius._7_1_ =
           ON_BinaryArchive::ReadInt(_minor_version,&(this->super_ON_ArcCurve).m_dim);
    }
    if (((this->super_ON_ArcCurve).m_dim != 2) && ((this->super_ON_ArcCurve).m_dim != 3)) {
      (this->super_ON_ArcCurve).m_dim = 3;
    }
    ON_Circle::~ON_Circle((ON_Circle *)local_b0);
  }
  return (bool)(circle.radius._7_1_ & 1);
}

Assistant:

bool ON__OBSOLETE__CircleCurve::Read(
       ON_BinaryArchive& file // open binary file
     )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc)
  {
    if (major_version==1) 
    {
      // common to all 1.x versions
      ON_Circle circle;
      rc = file.ReadCircle( circle );
      m_arc = circle;
      if (rc) 
        rc = file.ReadInterval( m_t );
      if (rc) 
        rc = file.ReadInt(&m_dim);
      if ( m_dim != 2 && m_dim != 3 )
        m_dim = 3;
    }
  }

  return rc;
}